

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Data_Query_PDU::Encode(Data_Query_PDU *this,KDataStream *stream)

{
  uint *puVar1;
  uint *puVar2;
  
  Simulation_Management_Header::Encode(&this->super_Simulation_Management_Header,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32RequestID);
  (*(this->m_TimeInterval).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_TimeInterval,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32NumFixedDatum);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32NumVariableDatum);
  puVar1 = (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->m_vFixedDatum).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    KDataStream::Write<unsigned_int>(stream,*puVar2);
  }
  puVar1 = (this->m_vVariableDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->m_vVariableDatum).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    KDataStream::Write<unsigned_int>(stream,*puVar2);
  }
  return;
}

Assistant:

void Data_Query_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );
    stream << m_ui32RequestID
           << KDIS_STREAM m_TimeInterval
           << m_ui32NumFixedDatum
           << m_ui32NumVariableDatum;

    vector<KUINT32>::const_iterator citrFixed = m_vFixedDatum.begin();
    vector<KUINT32>::const_iterator citrFixedEnd = m_vFixedDatum.end();
    for( ; citrFixed != citrFixedEnd; ++citrFixed )
    {
        stream << *citrFixed;
    }

    vector<KUINT32>::const_iterator citrVar = m_vVariableDatum.begin();
    vector<KUINT32>::const_iterator citrVarEnd = m_vVariableDatum.end();
    for( ; citrVar != citrVarEnd; ++citrVar )
    {
        stream << *citrVar;
    }
}